

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::MILSpec::Argument::~Argument(Argument *this)

{
  ~Argument(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Argument::~Argument() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.Argument)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}